

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O0

void project_monster_handler_STORM(project_monster_handler_context_t *context)

{
  short sVar1;
  _Bool _Var2;
  uint32_t uVar3;
  wchar_t wVar4;
  wchar_t local_24;
  project_monster_handler_context_t *context_local;
  
  project_monster_resist_other(context,L'V',L'\0',false,MON_MSG_IMMUNE);
  if (context->dam != L'\0') {
    _Var2 = flag_has_dbg(context->mon->race->flags,0xc,0x51,"context->mon->race->flags","RF_IM_ELEC"
                        );
    if (_Var2) {
      context->dam = context->dam / 2;
      context->hurt_msg = MON_MSG_RESIST_SOMEWHAT;
    }
    else {
      uVar3 = Rand_div(6);
      if (uVar3 == 0) {
        context->dam = context->dam / 2 + context->dam;
        context->hurt_msg = MON_MSG_STRUCK_ELEC;
      }
    }
    if ((L'2' < context->dam) && (uVar3 = Rand_div(2), uVar3 == 0)) {
      if (context->dam / 0xc < 0x15) {
        local_24 = context->dam / 0xc;
      }
      else {
        local_24 = L'\x14';
      }
      wVar4 = adjust_radius(context,local_24);
      context->mon_timed[1] = wVar4;
    }
    if ((L'\x14' < context->dam) && (uVar3 = Rand_div(3), uVar3 == 0)) {
      wVar4 = adjust_radius(context,context->dam / 10);
      context->mon_timed[2] = wVar4;
    }
    _Var2 = flag_has_dbg(context->mon->race->flags,0xd,0x15,"context->mon->race->flags",
                         "RSF_BR_GRAV");
    if ((!_Var2) &&
       (sVar1 = context->mon->maxhp, uVar3 = Rand_div(context->dam * 3), (int)sVar1 < (int)uVar3)) {
      context->teleport_distance = L'\n';
    }
  }
  return;
}

Assistant:

static void project_monster_handler_STORM(project_monster_handler_context_t *context)
{
	/* Water - zero out the damage because this is an immunity flag. */
	project_monster_resist_other(context, RF_IM_WATER, 0, false, MON_MSG_IMMUNE);
	if (context->dam == 0) return;

	/* Electricity */
	if (rf_has(context->mon->race->flags, RF_IM_ELEC)) {
		context->dam /= 2;
		context->hurt_msg = MON_MSG_RESIST_SOMEWHAT;
	} else if (one_in_(6)) {
		context->dam += context->dam / 2;
		context->hurt_msg = MON_MSG_STRUCK_ELEC;
	}

	/* Can stun, if enough damage is done. */
	if ((context->dam > 50) && one_in_(2)) {
		context->mon_timed[MON_TMD_STUN] =
			adjust_radius(context, MIN(context->dam / 12, 20));
	}

	/* Can confuse, if monster can be confused. */
	if ((context->dam > 20) && one_in_(3)) {
		context->mon_timed[MON_TMD_CONF] =
			adjust_radius(context, context->dam / 10);
	}

	/* Throw the monster around sometimes */
	if (!rsf_has(context->mon->race->flags, RSF_BR_GRAV) &&
		context->mon->maxhp < randint0(context->dam * 3)) {
		context->teleport_distance = 10;
	}
}